

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmerdb.cpp
# Opt level: O3

uint64_t find_kmer_db_vector(vector<unsigned_long,_std::allocator<unsigned_long>_> *kmers,
                            uint64_t kmer,uint32_t kmer_size)

{
  ulong *puVar1;
  ulong uVar2;
  ulong *puVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = kmer >> 0x38 | (kmer & 0xff000000000000) >> 0x28 | (kmer & 0xff0000000000) >> 0x18 |
          (kmer & 0xff00000000) >> 8 | (kmer & 0xff000000) << 8 | (kmer & 0xff0000) << 0x18 |
          (kmer & 0xff00) << 0x28 | kmer << 0x38;
  uVar2 = (uVar2 & 0xf0f0f0f0f0f0f0f) << 4 | uVar2 >> 4 & 0xf0f0f0f0f0f0f0f;
  uVar2 = ~((uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0xf333333333333333) * 4) >>
          ((char)kmer_size * -2 & 0x3fU);
  if (kmer < uVar2) {
    uVar2 = kmer;
  }
  puVar3 = (kmers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (kmers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = (long)puVar1 - (long)puVar3 >> 3;
  if (0 < (long)uVar6) {
    do {
      uVar5 = uVar6 >> 1;
      if ((puVar3[uVar5] & 0x3fffffffffffffff) < (uVar2 & 0x3fffffffffffffff)) {
        puVar3 = puVar3 + uVar5 + 1;
        uVar5 = ~uVar5 + uVar6;
      }
      uVar6 = uVar5;
    } while (0 < (long)uVar5);
  }
  if (puVar3 == puVar1) {
    uVar4 = 0;
  }
  else {
    uVar4 = (uint64_t)((*puVar3 & 0x3fffffffffffffff) <= (uVar2 & 0x3fffffffffffffff));
  }
  return uVar4;
}

Assistant:

uint64_t find_kmer_db_vector(vector<uint64_t> *kmers , uint64_t kmer, uint32_t kmer_size){
    uint64_t k, flag;
    tie(k, flag)  = is_canonized_kmer_representation_flag(kmer, kmer_size);
    
    uint64_t ret =(uint64_t ) binary_search(kmers->begin(), kmers->end(), k, 
        [](const uint64_t & a, const uint64_t & b) -> bool
		{return (a&0x3FFFFFFFFFFFFFFF) < (b&0x3FFFFFFFFFFFFFFF);});

    return ret;
}